

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_features.pb.cc
# Opt level: O1

void __thiscall pb::TestFeatures::Clear(TestFeatures *this)

{
  uint uVar1;
  
  uVar1 = (this->field_0)._impl_._has_bits_.has_bits_[0];
  if ((char)uVar1 != '\0') {
    *(undefined8 *)((long)&this->field_0 + 0x18) = 0;
    *(undefined8 *)((long)&this->field_0 + 0x20) = 0;
    *(undefined8 *)((long)&this->field_0 + 8) = 0;
    *(undefined8 *)((long)&this->field_0 + 0x10) = 0;
  }
  if ((uVar1 & 0xff00) != 0) {
    *(undefined8 *)((long)&this->field_0 + 0x38) = 0;
    *(undefined8 *)((long)&this->field_0 + 0x40) = 0;
    *(undefined8 *)((long)&this->field_0 + 0x28) = 0;
    *(undefined8 *)((long)&this->field_0 + 0x30) = 0;
  }
  (this->field_0)._impl_.value_lifetime_feature_ = 0;
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  if (((this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoClear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestFeatures::Clear() {
// @@protoc_insertion_point(message_clear_start:pb.TestFeatures)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    ::memset(&_impl_.file_feature_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.service_feature_) -
        reinterpret_cast<char*>(&_impl_.file_feature_)) + sizeof(_impl_.service_feature_));
  }
  if ((cached_has_bits & 0x0000ff00u) != 0) {
    ::memset(&_impl_.method_feature_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.legacy_feature_) -
        reinterpret_cast<char*>(&_impl_.method_feature_)) + sizeof(_impl_.legacy_feature_));
  }
  _impl_.value_lifetime_feature_ = 0;
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}